

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

error_code llvm::errorToErrorCode(Error *Err)

{
  ErrorInfoBase *pEVar1;
  _func_int *p_Var2;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> uVar3;
  char cVar4;
  ErrorInfoBase EVar5;
  Error EVar6;
  _func_int *p_Var7;
  undefined1 local_78 [8];
  error_code EC;
  anon_class_8_1_3fcf615c local_60;
  Error local_58;
  _func_int **local_50;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_48;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_40;
  Error local_38;
  
  local_78._0_4_ = 0;
  EC._0_8_ = std::_V2::system_category();
  pEVar1 = Err->Payload;
  Err->Payload = (ErrorInfoBase *)0x0;
  EVar5._vptr_ErrorInfoBase = (_func_int **)((ulong)pEVar1 & 0xfffffffffffffffe);
  local_60.EC = (error_code *)local_78;
  if (EVar5._vptr_ErrorInfoBase == (_func_int **)0x0) {
    local_38.Payload = (ErrorInfoBase *)0x1;
  }
  else {
    cVar4 = (**(code **)(*EVar5._vptr_ErrorInfoBase + 0x30))(EVar5._vptr_ErrorInfoBase);
    if (cVar4 == '\0') {
      local_40._M_t.
      super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
            )(__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
              )EVar5._vptr_ErrorInfoBase;
      handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
                ((llvm *)&local_38,&local_40,&local_60);
      if (local_40._M_t.
          super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t
          .super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
          super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)0x0) {
        (**(code **)(*(long *)local_40._M_t.
                              super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                              .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl + 8)
        )();
      }
      local_40._M_t.
      super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
            )(__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)0x0;
      EVar5._vptr_ErrorInfoBase = (_func_int **)0x0;
      EVar6.Payload = local_38.Payload;
    }
    else {
      local_38.Payload = (ErrorInfoBase *)0x1;
      p_Var7 = EVar5._vptr_ErrorInfoBase[1];
      p_Var2 = EVar5._vptr_ErrorInfoBase[2];
      EVar6.Payload = (ErrorInfoBase *)0x1;
      local_50 = EVar5._vptr_ErrorInfoBase;
      if (p_Var7 != p_Var2) {
        do {
          local_48._M_head_impl = *(ErrorInfoBase **)p_Var7;
          *(long *)p_Var7 = 0;
          local_58.Payload = EVar6.Payload;
          handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
                    ((llvm *)&EC._M_cat,
                     (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                     &local_48,&local_60);
          ErrorList::join((ErrorList *)&local_40,&local_58,(Error *)&EC._M_cat);
          uVar3._M_t.
          super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t
          .super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
          super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
               local_40._M_t.
               super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
               .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
          local_40._M_t.
          super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t
          .super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
          super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
               (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
                )(__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)
                 0x0;
          if ((long *)((ulong)EC._M_cat & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)((ulong)EC._M_cat & 0xfffffffffffffffe) + 8))();
          }
          if (local_48._M_head_impl != (ErrorInfoBase *)0x0) {
            (*(local_48._M_head_impl)->_vptr_ErrorInfoBase[1])();
          }
          local_48._M_head_impl = (ErrorInfoBase *)0x0;
          if ((long *)((ulong)local_58.Payload & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)((ulong)local_58.Payload & 0xfffffffffffffffe) + 8))();
          }
          EVar6.Payload =
               (ErrorInfoBase *)
               ((ulong)uVar3._M_t.
                       super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                       .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl | 1);
          p_Var7 = p_Var7 + 8;
          EVar5._vptr_ErrorInfoBase = local_50;
        } while (p_Var7 != p_Var2);
      }
    }
    local_38.Payload = EVar6.Payload;
    if (EVar5._vptr_ErrorInfoBase != (_func_int **)0x0) {
      (**(code **)(*EVar5._vptr_ErrorInfoBase + 8))();
    }
  }
  cantFail(&local_38,(char *)0x0);
  if ((long *)((ulong)local_38.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_38.Payload & 0xfffffffffffffffe) + 8))();
  }
  llvm_unreachable_internal
            ("inconvertible error code",
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/Error.cpp"
             ,0x4f);
}

Assistant:

std::error_code errorToErrorCode(Error Err) {
  std::error_code EC;
  handleAllErrors(std::move(Err), [&](const ErrorInfoBase &EI) {
    EC = EI.convertToErrorCode();
  });
  if (EC == inconvertibleErrorCode())
    report_fatal_error(EC.message());
  return EC;
}